

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemSubroutine.cpp
# Opt level: O3

bool __thiscall
slang::ast::SystemSubroutine::noHierarchical
          (SystemSubroutine *this,EvalContext *context,Expression *expr)

{
  bool bVar1;
  bool bVar2;
  Diagnostic *this_00;
  
  bVar1 = Expression::hasHierarchicalReference(expr);
  bVar2 = true;
  if (((bVar1) && (((((context->astCtx).scope.ptr)->compilation->options).flags.m_bits & 1) == 0))
     && (((context->flags).m_bits & 1) == 0)) {
    this_00 = EvalContext::addDiag(context,(DiagCode)0x27000b,expr->sourceRange);
    Diagnostic::operator<<(this_00,&this->name);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool SystemSubroutine::noHierarchical(EvalContext& context, const Expression& expr) const {
    if (expr.hasHierarchicalReference() &&
        !context.getCompilation().hasFlag(CompilationFlags::AllowHierarchicalConst) &&
        !context.flags.has(EvalFlags::IsScript)) {
        context.addDiag(diag::SysFuncHierarchicalNotAllowed, expr.sourceRange) << name;
        return false;
    }

    return true;
}